

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O2

int __thiscall
QtMWidgets::NavigationBar::setMainWidget(NavigationBar *this,QString *title,QWidget *widget)

{
  NavigationBarPrivate *pNVar1;
  QWidget *pQVar2;
  int iVar3;
  NavigationItem *ptr;
  iterator iVar4;
  QSharedPointer<QtMWidgets::NavigationItem> *this_00;
  QWidget *widget_local;
  QSharedPointer<QtMWidgets::NavigationItem> local_38;
  
  widget_local = widget;
  iVar3 = QStackedWidget::addWidget((QWidget *)((this->d).d)->stack);
  pNVar1 = (this->d).d;
  ptr = (NavigationItem *)operator_new(0x40);
  (ptr->title).d.d = (Data *)0x0;
  (ptr->title).d.ptr = (char16_t *)0x0;
  (ptr->title).d.size = 0;
  ptr->self = (QWidget *)0x0;
  (ptr->children).d.d = (Data *)0x0;
  (ptr->children).d.ptr = (QSharedPointer<QtMWidgets::NavigationItem> *)0x0;
  (ptr->children).d.size = 0;
  ptr->parent = (NavigationItem *)0x0;
  QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer<QtMWidgets::NavigationItem,_true>
            (&local_38,ptr);
  QList<QSharedPointer<QtMWidgets::NavigationItem>>::
  emplaceBack<QSharedPointer<QtMWidgets::NavigationItem>>
            ((QList<QSharedPointer<QtMWidgets::NavigationItem>> *)&pNVar1->rootItems,&local_38);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(local_38.d);
  iVar4 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::end(&((this->d).d)->rootItems);
  this_00 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                      (&((this->d).d)->itemsMap,&widget_local);
  QSharedPointer<QtMWidgets::NavigationItem>::operator=(this_00,iVar4.i + -1);
  iVar4 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::end(&((this->d).d)->rootItems);
  QString::operator=(&(iVar4.i[-1].value)->title,(QString *)title);
  pQVar2 = widget_local;
  iVar4 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::end(&((this->d).d)->rootItems);
  (iVar4.i[-1].value)->self = pQVar2;
  QStackedWidget::setCurrentIndex((int)((this->d).d)->stack);
  TextLabel::setText(((this->d).d)->title,title);
  return iVar3;
}

Assistant:

int
NavigationBar::setMainWidget( const QString & title,
	QWidget * widget )
{
	const int index = d->stack->addWidget( widget );

	d->rootItems.append(
		QSharedPointer< NavigationItem > ( new NavigationItem ) );
	d->itemsMap[ widget ] = d->rootItems.back();

	d->rootItems.back()->title = title;
	d->rootItems.back()->self = widget;

	d->stack->setCurrentIndex( index );
	d->title->setText( title );

	return index;
}